

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<BLOCK_SIZE,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::~IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  (this->
  super_ParamIteratorInterface<std::tuple<BLOCK_SIZE,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_00f63c68;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->current_value_).
              super___shared_ptr<std::tuple<BLOCK_SIZE,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
  ::~_Tuple_impl(&(this->current_).
                  super__Tuple_impl<0UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                );
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
  ::~_Tuple_impl(&(this->end_).
                  super__Tuple_impl<0UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                );
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
  ::~_Tuple_impl(&(this->begin_).
                  super__Tuple_impl<0UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                );
  return;
}

Assistant:

~IteratorImpl() override {}